

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O0

VertexIter __thiscall CMU462::HalfedgeMesh::newVertex(HalfedgeMesh *this)

{
  long in_RDI;
  Vertex *this_00;
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *in_stack_fffffffffffffea8;
  value_type *__x;
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *this_01;
  const_iterator in_stack_fffffffffffffeb8;
  iterator local_20;
  _List_const_iterator<CMU462::Vertex> local_18 [2];
  _List_node_base *local_8;
  
  this_00 = (Vertex *)(in_RDI + 0x18);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::end
                 (in_stack_fffffffffffffea8);
  std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(local_18,&local_20);
  __x = (value_type *)0x0;
  this_01 = (list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)0x0;
  Vertex::Vertex(this_00);
  local_8 = (_List_node_base *)
            std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::insert
                      (this_01,in_stack_fffffffffffffeb8,__x);
  Vertex::~Vertex((Vertex *)0x234ae9);
  return (VertexIter)local_8;
}

Assistant:

VertexIter newVertex() { return vertices.insert(vertices.end(), Vertex()); }